

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O1

float64 float64_sqrt(float64 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  float64 fVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  bits32 aLow;
  ulong uVar10;
  bits64 zSig;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  
  uVar3 = a & 0xfffffffffffff;
  uVar12 = (uint)(a >> 0x34);
  uVar6 = uVar12 & 0x7ff;
  if (uVar6 == 0x7ff) {
    if (uVar3 != 0) {
      fVar4 = propagateFloat64NaN(a,a);
      return fVar4;
    }
    if (-1 < (long)a) {
      return a;
    }
LAB_00468f75:
    float_exception_flags = float_exception_flags | 1;
    return 0xffffffffffffffff;
  }
  if ((long)a < 0) {
    if ((uVar12 & 0x7ff) == 0 && uVar3 == 0) {
      return a;
    }
    goto LAB_00468f75;
  }
  if ((short)uVar6 == 0) {
    if (uVar3 == 0) {
      return 0;
    }
    uVar10 = uVar3 >> 0x20;
    uVar11 = uVar10;
    if (uVar10 == 0) {
      uVar11 = uVar3;
    }
    uVar6 = (uint)uVar11 << 0x10;
    if (uVar11 >= 0x10000) {
      uVar6 = (uint)uVar11;
    }
    bVar9 = (uVar11 < 0x10000) * '\x10';
    bVar5 = bVar9 + 8;
    uVar12 = uVar6 << 8;
    if (0xffffff < uVar6) {
      bVar5 = bVar9;
      uVar12 = uVar6;
    }
    bVar5 = (((uVar10 == 0) << 5 | bVar5) +
            countLeadingZeros32_countLeadingZerosHigh[uVar12 >> 0x18]) - 0xb;
    uVar3 = uVar3 << (bVar5 & 0x3f);
    uVar6 = 1 - (int)(char)bVar5;
  }
  uVar10 = (uVar3 | 0x10000000000000) >> 0x15;
  uVar11 = (ulong)((ushort)(uVar3 >> 0x30) & 0xf);
  uVar12 = (uint)uVar10;
  uVar14 = ((uint)(uVar3 >> 0x20) & 0x1fffc0 | 0x100000) >> 6;
  if ((uVar6 & 1) == 0) {
    uVar13 = (uVar14 | 0x8000) - (uint)*(ushort *)(estimateSqrt32_sqrtEvenAdjustments + uVar11 * 2);
    uVar13 = (int)(((uVar3 & 0x1fffffffe00000 | 0x10000000000000) >> 0x15) / (ulong)uVar13) + uVar13
    ;
    uVar14 = 0xffff8000;
    if (uVar13 < 0x20000) {
      uVar14 = uVar13 * 0x8000;
    }
    if (uVar14 <= uVar12) {
      uVar12 = (int)uVar12 >> 1;
      goto LAB_00468fc3;
    }
  }
  else {
    uVar14 = (uVar14 - *(ushort *)(estimateSqrt32_sqrtOddAdjustments + uVar11 * 2)) + 0x4000;
    uVar14 = uVar14 * 0x8000 +
             (int)(((uVar3 & 0x1fffffffe00000 | 0x10000000000000) >> 0x15) / (ulong)uVar14) * 0x4000
    ;
    uVar10 = (ulong)(uVar12 >> 1);
  }
  uVar12 = (uVar14 >> 1) + (int)(((uVar10 & 0xffffffff) << 0x1f) / (ulong)uVar14);
LAB_00468fc3:
  uVar10 = CONCAT44(0,uVar12);
  uVar11 = (uVar3 | 0x10000000000000) << ((byte)uVar6 & 1 ^ 9);
  uVar3 = 0xffffffffffffffff;
  if (uVar11 < uVar10 << 0x20) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar11;
    uVar16 = SUB168(auVar2 / auVar1,0) << 0x20;
    for (lVar7 = uVar11 - SUB164(auVar2 / auVar1,0) * uVar10; lVar7 < 0; lVar7 = lVar7 + uVar10) {
      uVar16 = uVar16 - 0x100000000;
    }
    uVar3 = 0xffffffff;
    if ((ulong)(lVar7 << 0x20) < uVar10 << 0x20) {
      uVar3 = (ulong)(lVar7 << 0x20) / uVar10;
    }
    uVar3 = uVar3 | uVar16;
  }
  zSig = uVar10 * 0x40000000 + uVar3;
  if (((uint)uVar3 & 0x1fe) < 6) {
    uVar15 = zSig >> 0x20;
    uVar17 = (zSig & 0xffffffff) * uVar15;
    uVar16 = uVar17 >> 0x1f;
    uVar18 = zSig * zSig;
    uVar8 = -uVar18;
    lVar7 = ((uVar11 - (uVar18 != 0)) -
            ((uVar16 & 0xffffffff) + uVar15 * uVar15 + (uVar16 & 0x100000000))) -
            (ulong)(uVar18 < uVar17 << 0x21);
    if (lVar7 < 0) {
      uVar3 = (uVar10 * 0x80000000 + uVar3 * 2) - 1;
      do {
        zSig = zSig - 1;
        bVar19 = CARRY8(uVar8,uVar3);
        uVar8 = uVar8 + uVar3;
        lVar7 = (lVar7 - ((long)zSig >> 0x3f)) + (ulong)bVar19;
        uVar3 = uVar3 - 2;
      } while (lVar7 < 0);
    }
    zSig = zSig | (lVar7 != 0 || uVar8 != 0);
  }
  fVar4 = roundAndPackFloat64('\0',(short)((int)(short)uVar6 + 0x1fc01U >> 1) + 0x3fe,zSig);
  return fVar4;
}

Assistant:

float64 float64_sqrt( float64 a )
{
	flag aSign;
	int16 aExp, zExp;
	bits64 aSig, zSig, doubleZSig;
	bits64 rem0, rem1, term0, term1;
//    float64 z;

	aSig = extractFloat64Frac( a );
	aExp = extractFloat64Exp( a );
	aSign = extractFloat64Sign( a );
	if ( aExp == 0x7FF ) {
		if ( aSig ) return propagateFloat64NaN( a, a );
		if ( ! aSign ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aSign ) {
		if ( ( aExp | aSig ) == 0 ) return a;
		float_raise( float_flag_invalid );
		return float64_default_nan;
	}
	if ( aExp == 0 ) {
		if ( aSig == 0 ) return 0;
		normalizeFloat64Subnormal( aSig, &aExp, &aSig );
	}
	zExp = ( ( aExp - 0x3FF )>>1 ) + 0x3FE;
	aSig |= LIT64( 0x0010000000000000 );
	zSig = estimateSqrt32( aExp, aSig>>21 );
	aSig <<= 9 - ( aExp & 1 );
	zSig = estimateDiv128To64( aSig, 0, zSig<<32 ) + ( zSig<<30 );
	if ( ( zSig & 0x1FF ) <= 5 ) {
		doubleZSig = zSig<<1;
		mul64To128( zSig, zSig, &term0, &term1 );
		sub128( aSig, 0, term0, term1, &rem0, &rem1 );
		while ( (sbits64) rem0 < 0 ) {
			--zSig;
			doubleZSig -= 2;
			add128( rem0, rem1, zSig>>63, doubleZSig | 1, &rem0, &rem1 );
		}
		zSig |= ( ( rem0 | rem1 ) != 0 );
	}
	return roundAndPackFloat64( 0, zExp, zSig );

}